

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseDataListTest_Test::TestBody
          (OpenDDLParserTest_parseDataListTest_Test *this)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  Reference **ppRVar4;
  string *local_380;
  AssertHelper local_2a0;
  Message local_298;
  int local_28c;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_2;
  int res;
  size_t i;
  string *local_260;
  string local_258 [8];
  string expStrings [2];
  Message local_210;
  size_t local_208;
  uint local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__3;
  char token2 [23];
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  Message local_148;
  size_t local_140;
  uint local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  value_type_conflict1 local_118 [2];
  undefined1 local_110 [8];
  list<int,_std::allocator<int>_> expValues;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar__1;
  string local_b0;
  AssertHelper local_90;
  Message local_88 [3];
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  size_t sStack_58;
  ValueType type;
  size_t numValues;
  size_t numRefs;
  Reference *refs;
  char token1 [10];
  char *end;
  char *in;
  size_t len;
  Value *data;
  OpenDDLParserTest_parseDataListTest_Test *this_local;
  
  len = 0;
  in = (char *)0x0;
  stack0xffffffffffffffd0 = (char *)0x0;
  refs = (Reference *)0x342c332c322c317b;
  token1[0] = '}';
  token1[1] = '\0';
  data = (Value *)this;
  register0x00000000 = findEnd((char *)&refs,(size_t *)&in);
  numRefs = 0;
  numValues = 0;
  sStack_58 = 0;
  gtest_ar_.message_.ptr_._4_4_ = ddl_none;
  ppRVar4 = (Reference **)&numRefs;
  pcVar3 = OpenDDLParser::parseDataList
                     ((char *)&refs,register0x00000000,ddl_none,(Value **)&len,
                      &stack0xffffffffffffffa8,ppRVar4,&numValues);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_70,pcVar3 != (char *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar2) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_70,(AssertionResult *)"nullptr == in","true","false",
               (char *)ppRVar4);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x26f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(local_88);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    testing::AssertionResult::AssertionResult((AssertionResult *)local_c8,len != 0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar2) {
      testing::Message::Message(&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,
                 (internal *)local_c8,(AssertionResult *)"nullptr == data","true","false",
                 (char *)ppRVar4);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                 ,0x270,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      std::__cxx11::string::~string
                ((string *)
                 &expValues.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
      testing::Message::~Message(&local_d0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      std::__cxx11::list<int,_std::allocator<int>_>::list
                ((list<int,_std::allocator<int>_> *)local_110);
      local_118[1] = 1;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)local_110,local_118 + 1);
      local_118[0] = 2;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)local_110,local_118);
      gtest_ar.message_.ptr_._4_4_ = 3;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)local_110,
                 (value_type_conflict1 *)((long)&gtest_ar.message_.ptr_ + 4));
      gtest_ar.message_.ptr_._0_4_ = 4;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)local_110,
                 (value_type_conflict1 *)&gtest_ar.message_);
      local_134 = 4;
      local_140 = countItems((Value *)len);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_130,"4U","countItems(data)",&local_134,&local_140);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar2) {
        testing::Message::Message(&local_148);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x278,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_148)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_148);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      bVar2 = testValues<int>(ddl_int32,(Value *)len,(list<int,_std::allocator<int>_> *)local_110);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_160,bVar2);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar2) {
        testing::Message::Message(&local_168);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)(token2 + 0x10),(internal *)local_160,
                   (AssertionResult *)"testValues(Value::ValueType::ddl_int32, data, expValues)",
                   "false","true",(char *)ppRVar4);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x279,pcVar3);
        testing::internal::AssertHelper::operator=(&local_170,&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        std::__cxx11::string::~string((string *)(token2 + 0x10));
        testing::Message::~Message(&local_168);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,(Value *)len);
      sVar1 = numRefs;
      if (numRefs != 0) {
        Reference::~Reference((Reference *)numRefs);
        operator_delete((void *)sVar1,0x10);
      }
      gtest_ar__3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6e6972747322207b;
      builtin_strncpy(token2,"g1\",\"string2\"}",0xf);
      register0x00000000 = findEnd((char *)&gtest_ar__3.message_,(size_t *)&in);
      ppRVar4 = (Reference **)&numRefs;
      OpenDDLParser::parseDataList
                ((char *)&gtest_ar__3.message_,register0x00000000,gtest_ar_.message_.ptr_._4_4_,
                 (Value **)&len,&stack0xffffffffffffffa8,ppRVar4,&numValues);
      testing::AssertionResult::AssertionResult((AssertionResult *)local_1b8,len != 0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar2) {
        testing::Message::Message(&local_1c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_1b8,
                   (AssertionResult *)"nullptr == data","true","false",(char *)ppRVar4);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                   ,0x280,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_1c0);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        local_1fc = 2;
        local_208 = countItems((Value *)len);
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                  ((EqHelper<false> *)local_1f8,"2U","countItems(data)",&local_1fc,&local_208);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar2) {
          testing::Message::Message(&local_210);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&expStrings[1].field_2 + 8),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                     ,0x283,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&expStrings[1].field_2 + 8),&local_210);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)((long)&expStrings[1].field_2 + 8));
          testing::Message::~Message(&local_210);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        i._5_1_ = 1;
        local_260 = local_258;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_258,"string1",(allocator<char> *)((long)&i + 7));
        local_260 = (string *)(expStrings[0].field_2._M_local_buf + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(expStrings[0].field_2._M_local_buf + 8),"string2",
                   (allocator<char> *)((long)&i + 6));
        i._5_1_ = 0;
        std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
        for (; len != 0; len = *(size_t *)(len + 0x18)) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          gtest_ar_2.message_.ptr_._4_4_ =
               strncmp(pcVar3,*(char **)(len + 0x10),*(size_t *)(len + 8));
          local_28c = 0;
          testing::internal::EqHelper<true>::Compare<int,int>
                    (local_288,"0",(int *)0x1a2175,&local_28c,
                     (type *)((long)&gtest_ar_2.message_.ptr_ + 4));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
          if (!bVar2) {
            testing::Message::Message(&local_298);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
                       ,0x28b,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
            testing::internal::AssertHelper::~AssertHelper(&local_2a0);
            testing::Message::~Message(&local_298);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
        }
        OpenDDLParserTest::registerValueForDeletion(&this->super_OpenDDLParserTest,(Value *)0x0);
        sVar1 = numRefs;
        if (numRefs != 0) {
          Reference::~Reference((Reference *)numRefs);
          operator_delete((void *)sVar1,0x10);
        }
        local_380 = (string *)(expStrings[1].field_2._M_local_buf + 8);
        do {
          local_380 = local_380 + -0x20;
          std::__cxx11::string::~string(local_380);
        } while (local_380 != local_258);
        gtest_ar__1.message_.ptr_._4_4_ = 0;
      }
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)local_110);
    }
  }
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseDataListTest) {
    Value *data(nullptr);
    size_t len(0);

    char *in(nullptr), *end(nullptr);
    char token1[] = "{1,2,3,4}";
    end = findEnd(token1, len);
    Reference *refs(nullptr);
    size_t numRefs(0), numValues(0);
    Value::ValueType type(Value::ValueType::ddl_none);
    in = OpenDDLParser::parseDataList(token1, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with integers
    std::list<int> expValues;
    expValues.push_back(1);
    expValues.push_back(2);
    expValues.push_back(3);
    expValues.push_back(4);
    EXPECT_EQ(4U, countItems(data));
    EXPECT_TRUE(testValues(Value::ValueType::ddl_int32, data, expValues));
    registerValueForDeletion(data);
    delete refs;

    char token2[] = "{ \"string1\",\"string2\"}";
    end = findEnd(token2, len);
    in = OpenDDLParser::parseDataList(token2, end, type, &data, numValues, &refs, numRefs);
    ASSERT_FALSE(nullptr == data);

    // check intrinsic list with strings
    EXPECT_EQ(2U, countItems(data));
    std::string expStrings[2] = {
        "string1",
        "string2"
    };
    size_t i(0);
    while (nullptr != data) {
        const int res(strncmp(expStrings[i].c_str(), (char *)data->m_data, data->m_size));
        EXPECT_EQ(0, res);
        data = data->m_next;
        i++;
    }
    registerValueForDeletion(data);
    delete refs;
}